

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O0

void __thiscall denialofservice_tests::DoS_bantime::test_method(DoS_bantime *this)

{
  Options opts;
  bool bVar1;
  BanMan *this_00;
  pointer pPVar2;
  NodeId NVar3;
  long in_FS_OFFSET;
  NodeId id;
  int64_t nStartTime;
  unique_ptr<PeerManager,_std::default_delete<PeerManager>_> peerLogic;
  __single_object connman;
  __single_object banman;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock35;
  CNode dummyNode;
  CAddress addr;
  Mutex *in_stack_fffffffffffff8b8;
  CNode *this_01;
  ArgsManager *in_stack_fffffffffffff8c0;
  CNode *this_02;
  unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *in_stack_fffffffffffff8c8;
  ulong uVar4;
  assertion_result *this_03;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  CTxMemPool *in_stack_fffffffffffff8d8;
  ChainstateManager *in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e8;
  uint32_t in_stack_fffffffffffff8ec;
  CConnman *in_stack_fffffffffffff8f0;
  undefined7 in_stack_fffffffffffff8f8;
  undefined1 in_stack_fffffffffffff8ff;
  AddrMan *in_stack_fffffffffffff900;
  undefined7 in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff90f;
  int *in_stack_fffffffffffff910;
  Warnings *in_stack_fffffffffffff920;
  undefined8 in_stack_fffffffffffff928;
  undefined8 in_stack_fffffffffffff930;
  uint32_t in_stack_fffffffffffff938;
  assertion_result local_5f8 [2];
  const_string local_5c0;
  lazy_ostream local_5a0 [2];
  undefined1 in_stack_fffffffffffffa8f;
  shared_count in_stack_fffffffffffffa90;
  uint64_t in_stack_fffffffffffffa98;
  CAddress *in_stack_fffffffffffffaa0;
  shared_ptr<Sock> *in_stack_fffffffffffffaa8;
  NodeId in_stack_fffffffffffffab0;
  CNode *in_stack_fffffffffffffab8;
  undefined2 uStack_522;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffb14;
  string *in_stack_fffffffffffffb18;
  ConnectionType in_stack_fffffffffffffb20;
  uint7 in_stack_fffffffffffffb31;
  undefined1 local_4b8 [88];
  undefined1 local_460 [1112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_fffffffffffff8b8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8),
             &in_stack_fffffffffffff8f0->m_total_bytes_sent_mutex,
             (char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
             (char *)in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff8d8 >> 0x18,0));
  ArgsManager::GetDataDirBase(in_stack_fffffffffffff8c0);
  fs::operator/((path *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                (char *)in_stack_fffffffffffff8c8);
  std::make_unique<BanMan,fs::path,decltype(nullptr),unsigned_int_const&>
            ((path *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             (void **)in_stack_fffffffffffff900,
             (uint *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
  fs::path::~path((path *)in_stack_fffffffffffff8b8);
  fs::path::~path((path *)in_stack_fffffffffffff8b8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator*(in_stack_fffffffffffff8c8);
  std::unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>::operator*
            ((unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> *)
             in_stack_fffffffffffff8c8);
  Params();
  std::make_unique<CConnman,int,int,AddrMan&,NetGroupManager_const&,CChainParams_const&>
            (in_stack_fffffffffffff910,
             (int *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             in_stack_fffffffffffff900,
             (NetGroupManager *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8),
             (CChainParams *)in_stack_fffffffffffff8f0);
  std::unique_ptr<CConnman,_std::default_delete<CConnman>_>::operator*
            ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)in_stack_fffffffffffff8c8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator*(in_stack_fffffffffffff8c8);
  std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::get
            ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)in_stack_fffffffffffff8b8);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff8c8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffff8c8);
  this_00 = (BanMan *)
            std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::operator*
                      ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
                       in_stack_fffffffffffff8c8);
  uVar4 = CONCAT26(uStack_522,100);
  opts.max_extra_txs = (int)in_stack_fffffffffffff930;
  opts.capture_messages = (bool)(char)((ulong)in_stack_fffffffffffff930 >> 0x20);
  opts.deterministic_rng = (bool)(char)((ulong)in_stack_fffffffffffff930 >> 0x28);
  opts._14_2_ = (short)((ulong)in_stack_fffffffffffff930 >> 0x30);
  opts.ignore_incoming_txs = (bool)(char)in_stack_fffffffffffff928;
  opts.reconcile_txs = (bool)(char)((ulong)in_stack_fffffffffffff928 >> 8);
  opts._2_2_ = (short)((ulong)in_stack_fffffffffffff928 >> 0x10);
  opts.max_orphan_txs = (int)((ulong)in_stack_fffffffffffff928 >> 0x20);
  opts.max_headers_result = in_stack_fffffffffffff938;
  PeerManager::make(in_stack_fffffffffffff8f0,
                    (AddrMan *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                    (BanMan *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
                    in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff920,
                    opts);
  std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
            ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)this_00);
  BanMan::ClearBanned(this_00);
  GetTime();
  SetMockTime((int64_t)this_00);
  ip(in_stack_fffffffffffff8ec);
  CAddress::CAddress((CAddress *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                     (CService *)in_stack_fffffffffffff8e0,(ServiceFlags)in_stack_fffffffffffff8d8);
  CService::~CService((CService *)this_00);
  std::shared_ptr<Sock>::shared_ptr((shared_ptr<Sock> *)this_00,(nullptr_t)0x5c3803);
  CAddress::CAddress((CAddress *)in_stack_fffffffffffff8d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             (char *)in_stack_fffffffffffff900,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
  uVar5 = 0;
  std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>::
  unique_ptr<std::default_delete<i2p::sam::Session>,void>
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)this_00,
             (nullptr_t)0x5c3861);
  this_02 = (CNode *)local_4b8;
  this_01 = (CNode *)(local_4b8 + 0x20);
  this_03 = (assertion_result *)(uVar4 & 0xffffffff00000000);
  CNode::CNode(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
               in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
               (uint64_t)in_stack_fffffffffffffa90.pi_,
               (CAddress *)CONCAT44(in_stack_fffffffffffffb14,uVar5),in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb20 & 0xffffff00,(bool)in_stack_fffffffffffffa8f,
               (CNodeOptions *)((ulong)in_stack_fffffffffffffb31 << 8));
  CNodeOptions::~CNodeOptions((CNodeOptions *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffabf);
  CAddress::~CAddress((CAddress *)this_01);
  std::shared_ptr<Sock>::~shared_ptr((shared_ptr<Sock> *)this_01);
  CNode::SetCommonVersion(this_02,(int)((ulong)this_01 >> 0x20));
  pPVar2 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_01);
  (**(pPVar2->super_NetEventsInterface)._vptr_NetEventsInterface)
            (&pPVar2->super_NetEventsInterface,local_460,1);
  std::atomic<bool>::operator=((atomic<bool> *)this_01,false);
  pPVar2 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_01);
  NVar3 = CNode::GetId(this_01);
  (*(pPVar2->super_CValidationInterface)._vptr_CValidationInterface[0x13])(pPVar2,NVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8),
               (const_string *)in_stack_fffffffffffff8f0,
               CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (const_string *)in_stack_fffffffffffff8e0);
    pPVar2 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_01);
    (*(pPVar2->super_NetEventsInterface)._vptr_NetEventsInterface[4])
              (&pPVar2->super_NetEventsInterface,local_460);
    boost::test_tools::assertion_result::assertion_result(this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)this_02,(unsigned_long)this_01);
    this_01 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffa80,local_5a0,&local_5c0,0x1ac,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8),
               (const_string *)in_stack_fffffffffffff8f0,
               CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (const_string *)in_stack_fffffffffffff8e0);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)this_01);
    in_stack_fffffffffffff8ff =
         BanMan::IsDiscouraged
                   ((BanMan *)in_stack_fffffffffffff8f0,
                    (CNetAddr *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    boost::test_tools::assertion_result::assertion_result(this_03,SUB81((ulong)this_02 >> 0x38,0));
    in_stack_fffffffffffff8f0 = (CConnman *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)this_02,(unsigned_long)this_01);
    this_01 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5f8,(lazy_ostream *)&stack0xfffffffffffff9e8,
               (const_string *)&stack0xfffffffffffff9c8,0x1ad,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff8ec = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8ec);
  } while (bVar1);
  pPVar2 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_01);
  (*(pPVar2->super_NetEventsInterface)._vptr_NetEventsInterface[1])
            (&pPVar2->super_NetEventsInterface,local_460);
  CNode::~CNode(this_01);
  CAddress::~CAddress((CAddress *)this_01);
  std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::~unique_ptr
            ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_03);
  std::unique_ptr<CConnman,_std::default_delete<CConnman>_>::~unique_ptr
            ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)this_03);
  std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::~unique_ptr
            ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)this_03);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(DoS_bantime)
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    auto banman = std::make_unique<BanMan>(m_args.GetDataDirBase() / "banlist", nullptr, DEFAULT_MISBEHAVING_BANTIME);
    auto connman = std::make_unique<CConnman>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, banman.get(), *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    banman->ClearBanned();
    int64_t nStartTime = GetTime();
    SetMockTime(nStartTime); // Overrides future calls to GetTime()

    CAddress addr(ip(0xa0b0c001), NODE_NONE);
    NodeId id{0};
    CNode dummyNode{id++,
                    /*sock=*/nullptr,
                    addr,
                    /*nKeyedNetGroupIn=*/4,
                    /*nLocalHostNonceIn=*/4,
                    CAddress(),
                    /*addrNameIn=*/"",
                    ConnectionType::INBOUND,
                    /*inbound_onion=*/false};
    dummyNode.SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(dummyNode, NODE_NETWORK);
    dummyNode.fSuccessfullyConnected = true;

    peerLogic->UnitTestMisbehaving(dummyNode.GetId());
    BOOST_CHECK(peerLogic->SendMessages(&dummyNode));
    BOOST_CHECK(banman->IsDiscouraged(addr));

    peerLogic->FinalizeNode(dummyNode);
}